

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O2

void __thiscall MercuryJson::JSON::JSON(JSON *this,char *document,size_t size,bool manual_construct)

{
  int iVar1;
  undefined3 in_register_00000009;
  size_t *local_30;
  
  BlockAllocator<MercuryJson::JsonValue>::BlockAllocator(&this->allocator,size);
  this->input = document;
  this->input_len = size;
  this->document = (JsonValue *)0x0;
  iVar1 = posix_memalign(&local_30,0x40,size * 8 + 0x3f & 0xffffffffffffffc0);
  if (iVar1 != 0) {
    local_30 = (size_t *)0x0;
  }
  this->indices = local_30;
  this->idx_ptr = local_30;
  this->num_indices = 0;
  if (CONCAT31(in_register_00000009,manual_construct) == 0) {
    exec_stage1(this);
    exec_stage2(this);
  }
  return;
}

Assistant:

JSON::JSON(char *document, size_t size, bool manual_construct) : allocator(size) {
        input = document;
        input_len = size;
        this->document = nullptr;

        idx_ptr = indices = aligned_malloc<size_t>(size);
        num_indices = 0;
#if ALLOC_PARSED_STR
        literals = static_cast<char *>(aligned_malloc(size));
#endif

        if (!manual_construct) {
            exec_stage1();
            exec_stage2();
        }
    }